

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void FreeEpoll(stCoEpoll_t *ctx)

{
  if (ctx != (stCoEpoll_t *)0x0) {
    free(ctx->pstActiveList);
    free(ctx->pstTimeoutList);
    FreeTimeout(ctx->pTimeout);
    co_epoll_res_free(ctx->result);
  }
  free(ctx);
  return;
}

Assistant:

void FreeEpoll( stCoEpoll_t *ctx )
{
	if( ctx )
	{
		free( ctx->pstActiveList );
		free( ctx->pstTimeoutList );
		FreeTimeout( ctx->pTimeout );
		co_epoll_res_free( ctx->result );
	}
	free( ctx );
}